

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master.cpp
# Opt level: O2

RpcValue __thiscall
miniros::master::Master::searchParam(Master *this,string *caller_id,string *key,Connection *param_3)

{
  XmlRpcValue *pXVar1;
  anon_union_8_8_d5adaace_for__value extraout_RDX;
  char *rhs;
  RpcValue RVar2;
  XmlRpcValue local_50;
  string foundKey;
  
  XmlRpc::XmlRpcValue::Array((XmlRpcValue *)this,3);
  ParameterStorage::searchParam
            (&foundKey,(ParameterStorage *)(caller_id + 0x1d),key,(string *)param_3);
  if (foundKey._M_string_length == 0) {
    local_50._type = TypeInvalid;
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_50);
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    rhs = "searchParam param not found";
  }
  else {
    local_50._type = TypeBoolean;
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,0);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_50);
    pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,1);
    rhs = "searchParam success";
  }
  XmlRpc::XmlRpcValue::operator=(pXVar1,rhs);
  XmlRpc::XmlRpcValue::XmlRpcValue(&local_50,&foundKey);
  pXVar1 = XmlRpc::XmlRpcValue::operator[]((XmlRpcValue *)this,2);
  XmlRpc::XmlRpcValue::operator=(pXVar1,&local_50);
  XmlRpc::XmlRpcValue::~XmlRpcValue(&local_50);
  ::std::__cxx11::string::~string((string *)&foundKey);
  RVar2._value.asDouble = extraout_RDX.asDouble;
  RVar2._0_8_ = this;
  return RVar2;
}

Assistant:

Master::RpcValue Master::searchParam(const std::string& caller_id, const std::string& key, Connection*)
{
  RpcValue res = RpcValue::Array(3);
  std::string foundKey = m_parameterStorage.searchParam(caller_id, key);
  if (!foundKey.empty()) {
    res[0] = 1;
    res[1] = "searchParam success";
  } else {
    res[0] = 0;
    res[1] = "searchParam param not found";
  }
  res[2] = foundKey;
  return res;
}